

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::EndMissingDependentProperties
          (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this,SValue *sourceName)

{
  bool bVar1;
  SizeType length;
  StringRefType *pSVar2;
  CrtAllocator *pCVar3;
  ValueType *pVVar4;
  Ch *name;
  ValueType error;
  ValueType wrapper;
  Data local_d8 [3];
  StringRefType local_a0;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_90;
  PointerType schemaRef;
  
  bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Empty
                    (&this->missingDependents_);
  if (!bVar1) {
    error.data_.n = (Number)0x0;
    error.data_.s.str = (Ch *)0x3000000000000;
    pSVar2 = GetMissingString();
    local_a0.s = pSVar2->s;
    local_a0.length = pSVar2->length;
    pCVar3 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
              (&error,&local_a0,&this->missingDependents_,pCVar3);
    AddErrorCode(this,&error,kValidateErrorRequired);
    AddErrorInstanceLocation(this,&error,false);
    GetInvalidSchemaPointer((PointerType *)&wrapper,this);
    pVVar4 = internal::
             Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
             ::GetDependenciesString();
    GetInvalidSchemaPointer((PointerType *)&local_d8[0].s,this);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::Append(&schemaRef,
             (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              *)&wrapper,pVVar4,(CrtAllocator *)local_d8[0]._0_8_);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                       *)&local_d8[0].s);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                       *)&wrapper);
    name = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString(sourceName);
    length = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetStringLength
                       (sourceName);
    GetInvalidSchemaPointer((PointerType *)&wrapper,this);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::Append(&local_90,&schemaRef,name,length,(CrtAllocator *)wrapper.data_.n);
    AddErrorSchemaLocation(this,&error,&local_90);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer(&local_90);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                       *)&wrapper);
    wrapper.data_.n = (Number)0x0;
    wrapper.data_.s.str = (Ch *)0x3000000000000;
    pVVar4 = internal::
             Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
             ::GetRequiredString();
    pCVar3 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
    GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)&local_d8[0].s,pVVar4,
               pCVar3,false);
    pCVar3 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
              (&wrapper,(GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                        &local_d8[0].s,&error,pCVar3);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_d8[0].s);
    pCVar3 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    GenericValue<rapidjson::CrtAllocator>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_d8[0].s,
               sourceName,pCVar3,false);
    pCVar3 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
              (&this->currentError_,
               (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_d8[0].s,
               &wrapper,pCVar3);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_d8[0].s);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&wrapper);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer(&schemaRef);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&error);
  }
  return;
}

Assistant:

void EndMissingDependentProperties(const SValue& sourceName) {
        if (!missingDependents_.Empty()) {
            // Create equivalent 'required' error
            ValueType error(kObjectType);
            ValidateErrorCode code = kValidateErrorRequired;
            error.AddMember(GetMissingString(), missingDependents_.Move(), GetStateAllocator());
            AddErrorCode(error, code);
            AddErrorInstanceLocation(error, false);
            // When appending to a pointer ensure its allocator is used
            PointerType schemaRef = GetInvalidSchemaPointer().Append(SchemaType::GetValidateErrorKeyword(kValidateErrorDependencies), &GetInvalidSchemaPointer().GetAllocator());
            AddErrorSchemaLocation(error, schemaRef.Append(sourceName.GetString(), sourceName.GetStringLength(), &GetInvalidSchemaPointer().GetAllocator()));
            ValueType wrapper(kObjectType);
            wrapper.AddMember(ValueType(SchemaType::GetValidateErrorKeyword(code), GetStateAllocator()).Move(), error, GetStateAllocator());
            currentError_.AddMember(ValueType(sourceName, GetStateAllocator()).Move(), wrapper, GetStateAllocator());
        }
    }